

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balk.cpp
# Opt level: O2

void __thiscall Balk::Balk(Balk *this,int balk_size,double segment_length,double E,double J)

{
  vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_> *this_00;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  shared_ptr<Term> local_48;
  double local_38;
  double local_30;
  
  this->balk_size = balk_size;
  this->segment_length = segment_length;
  this->E = E;
  this->J = J;
  this_00 = &this->terms;
  (this->terms).super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->terms).super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->terms).super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->A).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->A).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->A).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_38 = E * J;
  local_30 = local_38;
  std::make_shared<InitShift,double>((double *)&local_58);
  local_48.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
  local_48.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Stack_50._M_pi;
  local_58 = (element_type *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<Term>,std::allocator<std::shared_ptr<Term>>>::
  emplace_back<std::shared_ptr<Term>>
            ((vector<std::shared_ptr<Term>,std::allocator<std::shared_ptr<Term>>> *)this_00,
             &local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
  local_30 = local_38;
  std::make_shared<InitAngle,double>((double *)&local_58);
  local_48.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
  local_48.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Stack_50._M_pi;
  local_58 = (element_type *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<Term>,std::allocator<std::shared_ptr<Term>>>::
  emplace_back<std::shared_ptr<Term>>
            ((vector<std::shared_ptr<Term>,std::allocator<std::shared_ptr<Term>>> *)this_00,
             &local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
  std::make_shared<InitMoment>();
  local_48.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
  local_48.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Stack_50._M_pi;
  local_58 = (element_type *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<Term>,std::allocator<std::shared_ptr<Term>>>::
  emplace_back<std::shared_ptr<Term>>
            ((vector<std::shared_ptr<Term>,std::allocator<std::shared_ptr<Term>>> *)this_00,
             &local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
  std::make_shared<InitForce>();
  local_48.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
  local_48.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Stack_50._M_pi;
  local_58 = (element_type *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<Term>,std::allocator<std::shared_ptr<Term>>>::
  emplace_back<std::shared_ptr<Term>>
            ((vector<std::shared_ptr<Term>,std::allocator<std::shared_ptr<Term>>> *)this_00,
             &local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
  return;
}

Assistant:

Balk::Balk(int balk_size, double segment_length, double E, double J)
    : balk_size(balk_size), segment_length(segment_length), E(E), J(J)
{
    terms.push_back(std::make_shared<InitShift>(E * J));
    terms.push_back(std::make_shared<InitAngle>(E * J));
    terms.push_back(std::make_shared<InitMoment>());
    terms.push_back(std::make_shared<InitForce>());
}